

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

size_t __thiscall TestRange<bool>::getSteps(TestRange<bool> *this)

{
  RangeType RVar1;
  double dVar2;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  
  RVar1 = this->type;
  if (RVar1 == EXPONENTIAL) {
    dVar5 = log((double)(int)this->end);
    dVar2 = log((double)(int)this->step);
    dVar5 = dVar5 / dVar2 + 1.0;
    uVar4 = (ulong)dVar5;
    sVar3 = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
  }
  else if (RVar1 == LINEAR) {
    sVar3 = ((ulong)this->end - (ulong)this->begin) + 1;
  }
  else if (RVar1 == ARRAY) {
    sVar3 = (ulong)(this->array).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
            ((long)(this->array).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)(this->array).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

size_t getSteps() {
        if (type == RangeType::ARRAY) {
            return array.size();
        } else if (type == RangeType::LINEAR) {
            return ((end - begin) / step) + 1;
        } else if (type == RangeType::EXPONENTIAL) {
            ssize_t coe = ((ssize_t)end) / ((ssize_t)begin);
            double steps_double = (double)std::log(coe) / std::log(step);
            return (size_t)(steps_double + 1);
        }

        return 0;
    }